

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int renameUnmapSelectCb(Walker *pWalker,Select *p)

{
  int iVar1;
  Parse *pPVar2;
  ExprList *pEVar3;
  char *pcVar4;
  SrcList *pSVar5;
  long lVar6;
  RenameToken *pRVar7;
  
  pPVar2 = pWalker->pParse;
  pEVar3 = p->pEList;
  if ((pEVar3 != (ExprList *)0x0) && (iVar1 = pEVar3->nExpr, 0 < (long)iVar1)) {
    lVar6 = 0;
    do {
      pcVar4 = pEVar3->a[lVar6].zName;
      if (pcVar4 != (char *)0x0) {
        for (pRVar7 = pPVar2->pRename; pRVar7 != (RenameToken *)0x0; pRVar7 = pRVar7->pNext) {
          if ((char *)pRVar7->p == pcVar4) {
            pRVar7->p = (void *)0x0;
            break;
          }
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar1);
  }
  pSVar5 = p->pSrc;
  if ((pSVar5 != (SrcList *)0x0) && (iVar1 = pSVar5->nSrc, 0 < (long)iVar1)) {
    lVar6 = 0;
    do {
      pRVar7 = pPVar2->pRename;
      if (pRVar7 != (RenameToken *)0x0) {
        do {
          if ((char *)pRVar7->p == pSVar5->a[lVar6].zName) {
            pRVar7->p = (void *)0x0;
            break;
          }
          pRVar7 = pRVar7->pNext;
        } while (pRVar7 != (RenameToken *)0x0);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar1);
  }
  return 0;
}

Assistant:

static int renameUnmapSelectCb(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i;
  if( ALWAYS(p->pEList) ){
    ExprList *pList = p->pEList;
    for(i=0; i<pList->nExpr; i++){
      if( pList->a[i].zName ){
        sqlite3RenameTokenRemap(pParse, 0, (void*)pList->a[i].zName);
      }
    }
  }
  if( ALWAYS(p->pSrc) ){  /* Every Select as a SrcList, even if it is empty */
    SrcList *pSrc = p->pSrc;
    for(i=0; i<pSrc->nSrc; i++){
      sqlite3RenameTokenRemap(pParse, 0, (void*)pSrc->a[i].zName);
    }
  }
  return WRC_Continue;
}